

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

int countDistanceSince(deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_> *history,
                      TaskIdentifier task)

{
  size_type sVar1;
  reference pvVar2;
  int local_20;
  int i;
  TaskIdentifier task_local;
  deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_> *history_local;
  
  sVar1 = std::deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::size(history);
  local_20 = (int)sVar1;
  do {
    local_20 = local_20 + -1;
    if (local_20 < 0) {
      return 10;
    }
    pvVar2 = std::deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::operator[]
                       (history,(long)local_20);
  } while (*pvVar2 != task);
  sVar1 = std::deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::size(history);
  return (int)sVar1 - local_20;
}

Assistant:

int countDistanceSince(std::deque<TaskIdentifier>& history, TaskIdentifier task)
{
	for (int i = history.size() - 1; i >= 0; i--)
	{
		if (history[i] == task)
		{
			return history.size() - i;
		}
	}

	return 10;
}